

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O1

Enumerator * __thiscall CParse::newEnumerator(CParse *this,string *ident)

{
  size_t *psVar1;
  Enumerator *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (Enumerator *)operator_new(0x30);
  Enumerator::Enumerator(this_00,ident);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->enum_alloc).super__List_base<Enumerator_*,_std::allocator<Enumerator_*>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

Enumerator *CParse::newEnumerator(const string &ident)

{
  Enumerator *res = new Enumerator(ident);
  enum_alloc.push_back(res);
  return res;
}